

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

int lj_err_unwind_dwarf(int version,int actions,uint64_t uexclass,_Unwind_Exception *uex,
                       _Unwind_Context *ctx)

{
  TValue *pTVar1;
  uint uVar2;
  long lVar3;
  lua_State *L_00;
  void *pvVar4;
  GCstr *pGVar5;
  lua_State *in_RCX;
  ulong in_RDX;
  uint in_ESI;
  code *pcVar6;
  int in_EDI;
  void *in_R8;
  int errcode;
  lua_State *L;
  void *cf;
  ErrMsg in_stack_ffffffffffffff8c;
  int local_3c;
  
  if (in_EDI == 1) {
    lVar3 = _Unwind_GetCFA(in_R8);
    L_00 = (lua_State *)(ulong)*(uint *)(lVar3 + 0x18);
    if ((in_ESI & 1) == 0) {
      if ((in_ESI & 2) != 0) {
        if ((in_RDX ^ 0x4c55414a49543200) < 0x100) {
          uVar2 = (uint)in_RDX & 0xff;
        }
        else {
          if ((in_ESI & 4) != 0) {
            _Unwind_DeleteException(in_RCX);
          }
          uVar2 = 2;
        }
        pvVar4 = err_unwind(in_RCX,in_R8,(int)((ulong)lVar3 >> 0x20));
        if ((in_ESI & 8) != 0) {
          return 8;
        }
        if (pvVar4 != (void *)0x0) {
          _Unwind_SetGR(in_R8,0,(long)(int)uVar2);
          pcVar6 = lj_vm_unwind_c_eh;
          if (((ulong)pvVar4 & 2) != 0) {
            pcVar6 = lj_vm_unwind_ff_eh;
          }
          _Unwind_SetIP(in_R8,pcVar6);
          return 7;
        }
        if ((in_ESI & 4) != 0) {
          _Unwind_SetGR(in_R8,0,(long)(int)uVar2);
          _Unwind_SetIP(in_R8,lj_vm_unwind_rethrow);
          return 7;
        }
      }
      local_3c = 8;
    }
    else {
      pvVar4 = err_unwind(in_RCX,in_R8,(int)((ulong)lVar3 >> 0x20));
      if (pvVar4 == (void *)0x0) {
        local_3c = 8;
      }
      else {
        if (0xff < (in_RDX ^ 0x4c55414a49543200)) {
          pTVar1 = L_00->top;
          L_00->top = pTVar1 + 1;
          pGVar5 = lj_err_str(L_00,in_stack_ffffffffffffff8c);
          (pTVar1->u32).lo = (uint32_t)pGVar5;
          (pTVar1->field_2).it = 0xfffffffb;
        }
        local_3c = 6;
      }
    }
  }
  else {
    local_3c = 3;
  }
  return local_3c;
}

Assistant:

LJ_FUNCA int lj_err_unwind_dwarf(int version, int actions,
  uint64_t uexclass, _Unwind_Exception *uex, _Unwind_Context *ctx)
{
  void *cf;
  lua_State *L;
  if (version != 1)
    return _URC_FATAL_PHASE1_ERROR;
  UNUSED(uexclass);
  cf = (void *)_Unwind_GetCFA(ctx);
  L = cframe_L(cf);
  if ((actions & _UA_SEARCH_PHASE)) {
#if LJ_UNWIND_EXT
    if (err_unwind(L, cf, 0) == NULL)
      return _URC_CONTINUE_UNWIND;
#endif
    if (!LJ_UEXCLASS_CHECK(uexclass)) {
      setstrV(L, L->top++, lj_err_str(L, LJ_ERR_ERRCPP));
    }
    return _URC_HANDLER_FOUND;
  }
  if ((actions & _UA_CLEANUP_PHASE)) {
    int errcode;
    if (LJ_UEXCLASS_CHECK(uexclass)) {
      errcode = LJ_UEXCLASS_ERRCODE(uexclass);
    } else {
      if ((actions & _UA_HANDLER_FRAME))
	_Unwind_DeleteException(uex);
      errcode = LUA_ERRRUN;
    }
#if LJ_UNWIND_EXT
    cf = err_unwind(L, cf, errcode);
    if ((actions & _UA_FORCE_UNWIND)) {
      return _URC_CONTINUE_UNWIND;
    } else if (cf) {
      _Unwind_SetGR(ctx, LJ_TARGET_EHRETREG, errcode);
      _Unwind_SetIP(ctx, (uintptr_t)(cframe_unwind_ff(cf) ?
				     lj_vm_unwind_ff_eh :
				     lj_vm_unwind_c_eh));
      return _URC_INSTALL_CONTEXT;
    }
#if LJ_TARGET_X86ORX64
    else if ((actions & _UA_HANDLER_FRAME)) {
      /* Workaround for ancient libgcc bug. Still present in RHEL 5.5. :-/
      ** Real fix: http://gcc.gnu.org/viewcvs/trunk/gcc/unwind-dw2.c?r1=121165&r2=124837&pathrev=153877&diff_format=h
      */
      _Unwind_SetGR(ctx, LJ_TARGET_EHRETREG, errcode);
      _Unwind_SetIP(ctx, (uintptr_t)lj_vm_unwind_rethrow);
      return _URC_INSTALL_CONTEXT;
    }
#endif
#else
    /* This is not the proper way to escape from the unwinder. We get away with
    ** it on non-x64 because the interpreter restores all callee-saved regs.
    */
    lj_err_throw(L, errcode);
#endif
  }
  return _URC_CONTINUE_UNWIND;
}